

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap32::ClearHeapBlock(HeapBlockMap32 *this,void *address,uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint currentPageCount;
  uint id2;
  uint id1;
  uint pageCount_local;
  void *address_local;
  HeapBlockMap32 *this_local;
  
  id2 = pageCount;
  _id1 = address;
  address_local = this;
  currentPageCount = GetLevel1Id(address);
  local_24 = GetLevel2Id(_id1);
  local_2c = 0x100 - local_24;
  puVar3 = min<unsigned_int>(&id2,&local_2c);
  local_28 = *puVar3;
  while( true ) {
    if (this->map[currentPageCount] == (L2MapChunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x92,"(map[id1] != nullptr)","map[id1] != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    L2MapChunk::Clear(this->map[currentPageCount],local_24,local_28);
    id2 = id2 - local_28;
    if (id2 == 0) break;
    local_24 = 0;
    currentPageCount = currentPageCount + 1;
    puVar3 = min<unsigned_int>(&id2,&L2Count);
    local_28 = *puVar3;
  }
  return;
}

Assistant:

void
HeapBlockMap32::ClearHeapBlock(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);
    uint id2 = GetLevel2Id(address);

    uint currentPageCount = min(pageCount, L2Count - id2);

    while (true)
    {
        Assert(map[id1] != nullptr);

        map[id1]->Clear(id2, currentPageCount);

        pageCount -= currentPageCount;
        if (pageCount == 0)
        {
            return;
        }

        id2 = 0;
        id1++;
        currentPageCount = min(pageCount, L2Count);
    }
}